

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateAccessorDeclarations
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  Formatter::operator()
            (&local_48,
             "private:\n$type$ ${1$_internal_$name$$}$(int index) const;\nvoid ${1$_internal_add_$name$$}$($type$ value);\n::$proto_ns$::RepeatedField<int>* ${1$_internal_mutable_$name$$}$();\npublic:\n$deprecated_attr$$type$ ${1$$name$$}$(int index) const;\n$deprecated_attr$void ${1$set_$name$$}$(int index, $type$ value);\n$deprecated_attr$void ${1$add_$name$$}$($type$ value);\n$deprecated_attr$const ::$proto_ns$::RepeatedField<int>& ${1$$name$$}$() const;\n$deprecated_attr$::$proto_ns$::RepeatedField<int>* ${1$mutable_$name$$}$();\n"
             ,&(this->super_FieldGenerator).descriptor_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "private:\n"
      "$type$ ${1$_internal_$name$$}$(int index) const;\n"
      "void ${1$_internal_add_$name$$}$($type$ value);\n"
      "::$proto_ns$::RepeatedField<int>* "
      "${1$_internal_mutable_$name$$}$();\n"
      "public:\n"
      "$deprecated_attr$$type$ ${1$$name$$}$(int index) const;\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, $type$ value);\n"
      "$deprecated_attr$void ${1$add_$name$$}$($type$ value);\n"
      "$deprecated_attr$const ::$proto_ns$::RepeatedField<int>& "
      "${1$$name$$}$() const;\n"
      "$deprecated_attr$::$proto_ns$::RepeatedField<int>* "
      "${1$mutable_$name$$}$();\n",
      descriptor_);
}